

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGlobalVC.cxx
# Opt level: O2

void __thiscall
cmCTestGlobalVC::DoRevision
          (cmCTestGlobalVC *this,Revision *revision,
          vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> *changes)

{
  cmCTest *this_00;
  _List_node_base *p_Var1;
  pointer pCVar2;
  __type _Var3;
  int iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
  *this_01;
  mapped_type *pmVar6;
  Revision *pRVar7;
  pointer pCVar8;
  allocator<char> local_201;
  Revision *local_200;
  Revision *local_1f8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>_>
  *local_1f0;
  string name;
  string local_1c8;
  ostringstream cmCTestLog_msg;
  char *__s;
  
  _Var3 = std::operator==(&revision->Rev,&this->OldRevision);
  if (_Var3) {
    cmCTestVC::Revision::operator=(&this->PriorRev,revision);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  std::operator<<((ostream *)&cmCTestLog_msg,".");
  std::ostream::flush();
  this_00 = (this->super_cmCTestVC).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestGlobalVC.cxx"
               ,0x23,name._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  std::__cxx11::list<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::push_back
            (&this->Revisions,revision);
  p_Var1 = (this->Revisions).
           super__List_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>._M_impl.
           _M_node.super__List_node_base._M_prev;
  poVar5 = std::operator<<((this->super_cmCTestVC).Log,"Found revision ");
  local_1f8 = (Revision *)(p_Var1 + 1);
  poVar5 = std::operator<<(poVar5,(string *)(p_Var1 + 1));
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"  author = ");
  poVar5 = std::operator<<(poVar5,(string *)(p_Var1 + 5));
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"  date = ");
  poVar5 = std::operator<<(poVar5,(string *)(p_Var1 + 3));
  std::operator<<(poVar5,"\n");
  pCVar2 = (changes->
           super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  local_1f0 = &this->Dirs;
  local_200 = &this->PriorRev;
  for (pCVar8 = (changes->
                super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                )._M_impl.super__Vector_impl_data._M_start; pCVar8 != pCVar2; pCVar8 = pCVar8 + 1) {
    iVar4 = (*(this->super_cmCTestVC)._vptr_cmCTestVC[8])(this,&pCVar8->Path);
    __s = (char *)CONCAT44(extraout_var,iVar4);
    if (__s != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,__s,(allocator<char> *)&local_1c8);
      cmsys::SystemTools::GetFilenamePath((string *)&cmCTestLog_msg,&name);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,__s,&local_201);
      cmsys::SystemTools::GetFilenameName(&name,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      this_01 = &std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>_>
                 ::operator[](local_1f0,(key_type *)&cmCTestLog_msg)->
                 super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
      ;
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
               ::operator[](this_01,&name);
      pRVar7 = pmVar6->Rev;
      if (pmVar6->Rev == (Revision *)0x0) {
        pRVar7 = local_200;
      }
      pmVar6->PriorRev = pRVar7;
      pmVar6->Rev = local_1f8;
      poVar5 = std::operator<<((this->super_cmCTestVC).Log,"  ");
      poVar5 = std::operator<<(poVar5,pCVar8->Action);
      poVar5 = std::operator<<(poVar5," ");
      poVar5 = std::operator<<(poVar5,__s);
      poVar5 = std::operator<<(poVar5," ");
      std::operator<<(poVar5,"\n");
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    }
  }
  return;
}

Assistant:

void cmCTestGlobalVC::DoRevision(Revision const& revision,
                                 std::vector<Change> const& changes)
{
  // Ignore changes in the old revision.
  if (revision.Rev == this->OldRevision) {
    this->PriorRev = revision;
    return;
  }

  // Indicate we found a revision.
  cmCTestLog(this->CTest, HANDLER_OUTPUT, "." << std::flush);

  // Store the revision.
  this->Revisions.push_back(revision);

  // Report this revision.
  Revision const& rev = this->Revisions.back();
  /* clang-format off */
  this->Log << "Found revision " << rev.Rev << "\n"
            << "  author = " << rev.Author << "\n"
            << "  date = " << rev.Date << "\n";
  /* clang-format on */

  // Update information about revisions of the changed files.
  for (Change const& c : changes) {
    if (const char* local = this->LocalPath(c.Path)) {
      std::string dir = cmSystemTools::GetFilenamePath(local);
      std::string name = cmSystemTools::GetFilenameName(local);
      File& file = this->Dirs[dir][name];
      file.PriorRev = file.Rev ? file.Rev : &this->PriorRev;
      file.Rev = &rev;
      this->Log << "  " << c.Action << " " << local << " "
                << "\n";
    }
  }
}